

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  ostream *poVar2;
  Renderer renderer;
  Game game;
  
  Renderer::Renderer(&renderer,0x280,0x280,0x20,0x20);
  Game::Game(&game,0x20,0x20);
  Game::Run(&game,&renderer,0x10);
  std::operator<<((ostream *)&std::cout,"Game has terminated successfully!\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"Score: ");
  iVar1 = Game::GetScore(&game);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"Size: ");
  iVar1 = Game::GetSize(&game);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::operator<<(poVar2,"\n");
  Game::~Game(&game);
  Renderer::~Renderer(&renderer);
  return 0;
}

Assistant:

int main() {
  constexpr std::size_t kFramesPerSecond{60};
  constexpr std::size_t kMsPerFrame{1000 / kFramesPerSecond};
  constexpr std::size_t kScreenWidth{640};
  constexpr std::size_t kScreenHeight{640};
  constexpr std::size_t kGridWidth{32};
  constexpr std::size_t kGridHeight{32};
    
  Renderer renderer(kScreenWidth, kScreenHeight, kGridWidth, kGridHeight);
  Game game(kGridWidth, kGridHeight);
  game.Run(renderer, kMsPerFrame);
  std::cout << "Game has terminated successfully!\n";
  std::cout << "Score: " << game.GetScore() << "\n";
  std::cout << "Size: " << game.GetSize() << "\n";
  return 0;
}